

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void singlevaraux(FuncState *fs,TString *n,expdesc *var,int base)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  Upvaldesc *pUVar4;
  BlockCnt *pBVar5;
  
  if (fs == (FuncState *)0x0) {
    var->t = -1;
    var->f = -1;
    iVar2 = 0;
    var->k = VVOID;
  }
  else {
    uVar1 = (uint)fs->nactvar;
    do {
      if ((int)uVar1 < 1) {
        uVar1 = 0xffffffff;
        break;
      }
      uVar1 = uVar1 - 1;
    } while (fs->f->locvars[(fs->ls->dyd->actvar).arr[(int)(fs->firstlocal + uVar1)].idx].varname !=
             n);
    if (-1 < (int)uVar1) {
      var->t = -1;
      var->f = -1;
      var->k = VLOCAL;
      (var->u).info = uVar1;
      if (base != 0) {
        return;
      }
      pBVar5 = (BlockCnt *)&fs->bl;
      do {
        pBVar5 = pBVar5->previous;
      } while ((int)uVar1 < (int)(uint)pBVar5->nactvar);
      pBVar5->upval = '\x01';
      return;
    }
    iVar2 = -1;
    if ((ulong)fs->nups != 0) {
      pUVar4 = fs->f->upvalues;
      uVar3 = 0;
      do {
        if (pUVar4->name == n) {
          iVar2 = (int)uVar3;
          break;
        }
        uVar3 = uVar3 + 1;
        pUVar4 = pUVar4 + 1;
      } while (fs->nups != uVar3);
    }
    if (iVar2 < 0) {
      singlevaraux(fs->prev,n,var,0);
      if (var->k == VVOID) {
        return;
      }
      iVar2 = newupvalue(fs,n,var);
    }
    var->t = -1;
    var->f = -1;
    var->k = VUPVAL;
  }
  (var->u).info = iVar2;
  return;
}

Assistant:

static void singlevaraux(FuncState *fs, TString *n, expdesc *var, int base) {
    if (fs == NULL)  /* no more levels? */
        init_exp(var, VVOID, 0);  /* default is global */
    else {
        int v = searchvar(fs, n);  /* look up locals at current level */
        if (v >= 0) {  /* found? */
            init_exp(var, VLOCAL, v);  /* variable is local */
            if (!base)
                markupval(fs, v);  /* local will be used as an upval */
        } else {  /* not found as local at current level; try upvalues */
            int idx = searchupvalue(fs, n);  /* try existing upvalues */
            if (idx < 0) {  /* not found? */
                singlevaraux(fs->prev, n, var, 0);  /* try upper levels */
                if (var->k == VVOID)  /* not found? */
                    return;  /* it is a global */
                /* else was LOCAL or UPVAL */
                idx = newupvalue(fs, n, var);  /* will be a new upvalue */
            }
            init_exp(var, VUPVAL, idx);  /* new or old upvalue */
        }
    }
}